

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

void __thiscall cmGeneratorTarget::TraceDependencies(cmGeneratorTarget *this)

{
  TargetType TVar1;
  cmTargetTraceDependencies tracer;
  cmTargetTraceDependencies local_100;
  
  TVar1 = cmTarget::GetType(this->Target);
  if (TVar1 != GLOBAL_TARGET) {
    cmTargetTraceDependencies::cmTargetTraceDependencies(&local_100,this);
    cmTargetTraceDependencies::Trace(&local_100);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_100.NewSources);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourcesWithOutput>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourcesWithOutput>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourcesWithOutput>_>_>
    ::~_Rb_tree(&local_100.NameMap._M_t);
    std::
    _Rb_tree<cmSourceFile_*,_cmSourceFile_*,_std::_Identity<cmSourceFile_*>,_std::less<cmSourceFile_*>,_std::allocator<cmSourceFile_*>_>
    ::~_Rb_tree(&local_100.SourcesQueued._M_t);
    std::_Deque_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::~_Deque_base
              ((_Deque_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)
               &local_100.SourceQueue);
  }
  return;
}

Assistant:

void cmGeneratorTarget::TraceDependencies()
{
  // CMake-generated targets have no dependencies to trace.  Normally tracing
  // would find nothing anyway, but when building CMake itself the "install"
  // target command ends up referencing the "cmake" target but we do not
  // really want the dependency because "install" depend on "all" anyway.
  if (this->GetType() == cmStateEnums::GLOBAL_TARGET) {
    return;
  }

  // Use a helper object to trace the dependencies.
  cmTargetTraceDependencies tracer(this);
  tracer.Trace();
}